

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_kv_test.cc
# Opt level: O0

void kv_set_var_test(btree_kv_ops *kv_ops)

{
  uint uVar1;
  undefined4 uVar2;
  uint16_t level_00;
  int iVar3;
  size_t sVar4;
  bnode *__ptr;
  long in_RDI;
  uint64_t value;
  char key [4];
  idx_t idx;
  int level;
  uint8_t vsize;
  uint8_t ksize;
  bnoderef node;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  undefined8 local_78;
  char local_6e [2];
  undefined2 uVar5;
  timeval local_18;
  long local_8;
  
  local_8 = in_RDI;
  gettimeofday(&local_18,(__timezone_ptr_t)0x0);
  memleak_start();
  _local_6e = 0x79656b;
  local_78 = 10;
  sVar4 = strlen(local_6e);
  uVar2 = _local_6e;
  uVar5 = 0;
  uVar1 = (uint)_local_6e >> 0x10;
  level_00 = (uint16_t)uVar1;
  _local_6e = uVar2;
  __ptr = dummy_node('\0','\0',level_00);
  (**(code **)(local_8 + 8))(__ptr,uVar5,local_6e,&local_78);
  iVar3 = memcmp((__ptr->field_4).data,local_6e,sVar4 & 0xff);
  if (iVar3 != 0) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
            ,0x73);
    kv_set_var_test::__test_pass = 0;
    iVar3 = memcmp((__ptr->field_4).data,local_6e,sVar4 & 0xff);
    if (iVar3 != 0) {
      __assert_fail("!(memcmp(node->data, key, ksize))",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                    ,0x73,"void kv_set_var_test(btree_kv_ops *)");
    }
  }
  iVar3 = memcmp((void *)((long)(__ptr->field_4).data + (long)(int)(uint)(byte)sVar4),&local_78,8);
  if (iVar3 != 0) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
            ,0x74);
    kv_set_var_test::__test_pass = 0;
    iVar3 = memcmp((void *)((long)(__ptr->field_4).data + (long)(int)(uint)(byte)sVar4),&local_78,8)
    ;
    if (iVar3 != 0) {
      __assert_fail("!(memcmp((uint8_t*)node->data + ksize, &value, vsize))",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                    ,0x74,"void kv_set_var_test(btree_kv_ops *)");
    }
  }
  free(__ptr);
  memleak_end();
  if (kv_set_var_test::__test_pass == 0) {
    fprintf(_stderr,"%s FAILED\n","kv set var test");
  }
  else {
    fprintf(_stderr,"%s PASSED\n","kv set var test");
  }
  return;
}

Assistant:

void kv_set_var_test(btree_kv_ops *kv_ops)
{
    TEST_INIT();
    memleak_start();

    bnoderef node;
    uint8_t ksize, vsize;
    int level;
    idx_t idx;
    char key[] = "key";
    uint64_t value = 10;

    ksize = strlen(key);
    vsize = sizeof(value);

    // set key/value in node
    idx = 0;
    level = 1;
    node = dummy_node(ksize, vsize, level);
    kv_ops->set_kv(node, idx, (void*)key, (void*)&value);

    // verify node->data
    TEST_CHK(!(memcmp(node->data, key, ksize)));
    TEST_CHK(!(memcmp((uint8_t*)node->data + ksize, &value, vsize)));

    free(node);

    memleak_end();
    TEST_RESULT("kv set var test");
}